

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O1

void work_mgga_exc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  uint uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar35;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  double dVar56;
  double dVar57;
  double __x;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  double dVar67;
  double dVar68;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined8 uVar76;
  double dVar77;
  double dVar78;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  double dVar90;
  double dVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  double dVar96;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double dVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  double local_2a8;
  double local_298;
  double local_260;
  double local_258;
  double local_1f8;
  double local_1e0;
  
  if (np != 0) {
    dVar55 = 0.0;
    __x = 0.0;
    local_1e0 = 0.0;
    sVar8 = 0;
    local_260 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar7 = (long)(p->dim).rho * sVar8;
        dVar14 = rho[lVar7] + rho[lVar7 + 1];
      }
      else {
        dVar14 = rho[(long)(p->dim).rho * sVar8];
      }
      dVar57 = p->dens_threshold;
      if (dVar57 <= dVar14) {
        lVar7 = (long)(p->dim).rho * sVar8;
        dVar14 = rho[lVar7];
        if (rho[lVar7] <= dVar57) {
          dVar14 = dVar57;
        }
        dVar15 = p->sigma_threshold * p->sigma_threshold;
        lVar9 = (long)(p->dim).sigma * sVar8;
        local_1f8 = sigma[lVar9];
        if (sigma[lVar9] <= dVar15) {
          local_1f8 = dVar15;
        }
        uVar1 = p->info->flags;
        if ((uVar1 >> 0x10 & 1) != 0) {
          local_1e0 = tau[(long)(p->dim).tau * sVar8];
          if (tau[(long)(p->dim).tau * sVar8] <= p->tau_threshold) {
            local_1e0 = p->tau_threshold;
          }
          if (((uVar1 >> 0x11 & 1) != 0) && (dVar36 = dVar14 * 8.0 * local_1e0, dVar36 <= local_1f8)
             ) {
            local_1f8 = dVar36;
          }
        }
        if (p->nspin == 2) {
          __x = rho[lVar7 + 1];
          if (rho[lVar7 + 1] <= dVar57) {
            __x = dVar57;
          }
          local_260 = sigma[lVar9 + 2];
          if (sigma[lVar9 + 2] <= dVar15) {
            local_260 = dVar15;
          }
          if ((uVar1 >> 0x10 & 1) != 0) {
            dVar55 = tau[(long)(p->dim).tau * sVar8 + 1];
            if (tau[(long)(p->dim).tau * sVar8 + 1] <= p->tau_threshold) {
              dVar55 = p->tau_threshold;
            }
            if (((uVar1 >> 0x11 & 1) != 0) && (dVar15 = __x * 8.0 * dVar55, dVar15 <= local_260)) {
              local_260 = dVar15;
            }
          }
        }
        dVar90 = 1.0 / (dVar14 + __x);
        dVar15 = p->zeta_threshold;
        dVar37 = dVar15 + -1.0;
        dVar91 = (__x + __x) * dVar90;
        dVar96 = -dVar37;
        dVar99 = (dVar14 - __x) * dVar90;
        uVar10 = -(ulong)(dVar91 <= dVar15);
        uVar11 = -(ulong)((dVar14 + dVar14) * dVar90 <= dVar15);
        dVar67 = (double)(uVar11 & (ulong)dVar37 |
                         ~uVar11 & (~uVar10 & (ulong)dVar99 | uVar10 & (ulong)dVar96)) + 1.0;
        dVar16 = cbrt(dVar15);
        dVar17 = cbrt(dVar67);
        dVar18 = cbrt(dVar14 + __x);
        dVar36 = (1.0 / local_1e0) * (1.0 / dVar14) * local_1f8 * 0.125;
        if (1.0 <= dVar36) {
          dVar36 = 1.0;
        }
        dVar38 = dVar36 * dVar36 * dVar36;
        dVar19 = cbrt(9.0);
        dVar20 = cbrt(0.3183098861837907);
        dVar39 = (1.0 / dVar18) * 1.4422495703074083 *
                 dVar20 * dVar20 * dVar19 * dVar19 * p->cam_omega;
        dVar19 = cbrt(9.869604401089358);
        dVar20 = cbrt(dVar14);
        dVar77 = 1.0 / (dVar20 * dVar20);
        auVar75._0_8_ = dVar19 * dVar19;
        auVar75._8_8_ = dVar14 * dVar14;
        auVar58._8_8_ = dVar77;
        auVar58._0_8_ = 0x3ff0000000000000;
        auVar58 = divpd(auVar58,auVar75);
        dVar56 = auVar58._0_8_;
        dVar21 = dVar56 * 1.8171205928321397;
        dVar35 = local_1f8 * auVar58._8_8_;
        dVar78 = dVar21 * dVar35;
        dVar68 = ((1.0 / dVar19) / 9.869604401089358) * 3.3019272488946267 * 0.002689949046226295;
        dVar20 = local_1f8 * local_1f8 * dVar68 *
                 ((1.0 / dVar20) / (auVar75._8_8_ * auVar75._8_8_ * dVar14)) +
                 dVar78 * 0.1504548888888889 + 1.0;
        dVar22 = pow(dVar20,0.1);
        dVar19 = p->zeta_threshold;
        uVar10 = -(ulong)(1.0 - dVar99 <= dVar19);
        uVar12 = -(ulong)(dVar99 + 1.0 <= dVar19);
        dVar23 = (double)(~uVar12 & (uVar10 & (ulong)dVar96 | ~uVar10 & (ulong)dVar99) |
                         uVar12 & (ulong)dVar37) + 1.0;
        dVar24 = cbrt(dVar23);
        uVar13 = -(ulong)(dVar23 <= dVar19);
        auVar26._8_8_ = uVar13 & (ulong)dVar16 | ~uVar13 & (ulong)dVar24;
        auVar26._0_8_ = dVar22;
        auVar26 = divpd(_DAT_0103b460,auVar26);
        dVar22 = (auVar26._0_8_ * auVar26._8_8_ * dVar39) / 18.0;
        dVar19 = 1e-10;
        if (1e-10 <= dVar22) {
          dVar19 = dVar22;
        }
        dVar22 = 1.35;
        if (dVar19 <= 1.35) {
          dVar22 = dVar19;
        }
        dVar23 = erf((1.0 / dVar22) * 0.5);
        dVar24 = exp((-1.0 / (dVar22 * dVar22)) * 0.25);
        if (1.35 <= dVar19) {
          dVar22 = dVar19;
          if (dVar19 <= 1.35) {
            dVar22 = 1.35;
          }
          auVar89._0_8_ = dVar22 * dVar22;
          dVar22 = auVar89._0_8_ * auVar89._0_8_;
          auVar89._8_8_ = dVar22;
          dVar23 = dVar22 * dVar22;
          auVar112._0_8_ = auVar89._0_8_ * dVar22;
          auVar112._8_8_ = dVar23 * dVar23;
          auVar95 = divpd(_DAT_0103b460,auVar89);
          auVar115 = divpd(auVar95,_DAT_01049d80);
          auVar102._8_8_ = dVar23;
          auVar102._0_8_ = auVar112._0_8_;
          auVar102 = divpd(_DAT_0103b460,auVar102);
          uVar76 = auVar102._8_8_;
          auVar95._8_8_ = 0x3ff0000000000000;
          auVar95._0_8_ = uVar76;
          auVar95 = divpd(auVar95,auVar112);
          auVar107._8_8_ = uVar76;
          auVar107._0_8_ = uVar76;
          auVar89 = divpd(auVar107,auVar89);
          auVar107 = divpd(auVar102,_DAT_01049d90);
          auVar102 = divpd(auVar89,_DAT_01049da0);
          auVar89 = divpd(auVar95,_DAT_01049db0);
          local_258 = ((((((auVar115._0_8_ - auVar115._8_8_) + auVar107._0_8_) - auVar107._8_8_) +
                        auVar102._0_8_) - auVar102._8_8_) + auVar89._0_8_) - auVar89._8_8_;
        }
        else {
          local_258 = dVar22 * -2.6666666666666665 *
                      (dVar23 * 1.7724538509055159 +
                      (dVar24 + -1.5 + (dVar24 + -1.0) * dVar22 * dVar22 * -2.0) * (dVar22 + dVar22)
                      ) + 1.0;
        }
        dVar22 = pow(dVar20,0.2);
        dVar20 = 0.27;
        if (dVar19 <= 0.27) {
          dVar20 = dVar19;
        }
        dVar40 = dVar20 * dVar20;
        dVar23 = exp((-1.0 / dVar40) * 0.25);
        dVar24 = erf((1.0 / dVar20) * 0.5);
        if (0.27 <= dVar19) {
          dVar20 = dVar19;
          if (dVar19 <= 0.27) {
            dVar20 = 0.27;
          }
          auVar59._0_8_ = dVar20 * dVar20;
          auVar43._0_8_ = auVar59._0_8_ * auVar59._0_8_;
          auVar119._0_8_ = auVar59._0_8_ * auVar43._0_8_;
          auVar119._8_8_ = auVar43._0_8_ * auVar43._0_8_;
          auVar79._0_8_ = auVar43._0_8_ * auVar119._8_8_;
          auVar79._8_8_ = auVar119._0_8_ * auVar119._8_8_;
          dVar20 = auVar119._8_8_ * auVar119._8_8_;
          auVar87._0_8_ = auVar59._0_8_ * auVar119._8_8_;
          auVar87._8_8_ = auVar59._0_8_ * dVar20;
          auVar103._0_8_ = 1.0 / (dVar20 * dVar20);
          auVar70._8_8_ = 0x3ff0000000000000;
          auVar70._0_8_ = auVar103._0_8_;
          auVar108._8_8_ = 0x3ff0000000000000;
          auVar108._0_8_ = auVar103._0_8_;
          auVar115._8_8_ = dVar20;
          auVar115._0_8_ = auVar119._8_8_;
          auVar102 = divpd(auVar108,auVar115);
          dVar20 = auVar102._8_8_;
          auVar110._0_8_ = -dVar20;
          auVar110._8_8_ = dVar20;
          auVar89 = divpd(auVar110,auVar119);
          auVar108 = divpd(auVar89,_DAT_010ab750);
          auVar117._8_8_ = auVar87._0_8_;
          auVar117._0_8_ = auVar79._0_8_;
          auVar116._8_8_ = dVar20;
          auVar116._0_8_ = dVar20;
          auVar89 = divpd(auVar116,auVar117);
          auVar117 = divpd(auVar89,_DAT_010ab760);
          auVar109._8_8_ = dVar20 / auVar79._8_8_;
          auVar109._0_8_ = auVar103._0_8_;
          auVar110 = divpd(auVar109,_DAT_010ab770);
          auVar103._8_8_ = auVar103._0_8_;
          auVar89 = divpd(auVar103,auVar79);
          auVar115 = divpd(auVar89,_DAT_010ab780);
          auVar59._8_8_ = auVar87._0_8_;
          auVar97._8_8_ = 0x3ff0000000000000;
          auVar97._0_8_ = auVar103._0_8_;
          auVar89 = divpd(auVar97,auVar59);
          auVar112 = divpd(auVar89,_DAT_010ab790);
          auVar43._8_8_ = auVar79._0_8_;
          auVar60._8_8_ = 0x3ff0000000000000;
          auVar60._0_8_ = auVar103._0_8_;
          auVar89 = divpd(auVar60,auVar43);
          auVar95 = divpd(auVar89,_DAT_010ab7a0);
          auVar80._8_8_ = auVar79._8_8_;
          auVar80._0_8_ = auVar119._0_8_;
          auVar27._8_8_ = 0x3ff0000000000000;
          auVar27._0_8_ = auVar103._0_8_;
          auVar89 = divpd(auVar27,auVar80);
          auVar89 = divpd(auVar89,_DAT_010ab7b0);
          auVar107 = divpd(auVar102,_DAT_010ab7c0);
          auVar102 = divpd(auVar70,auVar87);
          auVar102 = divpd(auVar102,_DAT_010ab7d0);
          dVar20 = auVar102._8_8_ +
                   auVar107._8_8_ +
                   auVar89._8_8_ +
                   auVar95._8_8_ +
                   auVar112._8_8_ +
                   (1.0 / auVar119._8_8_) * 3.804788961038961e-06 +
                   (1.0 / auVar119._0_8_) / -11520.0 +
                   0.0013392857142857143 / auVar43._0_8_ + (auVar115._0_8_ - auVar115._8_8_) +
                   (dVar20 / auVar43._0_8_) / 927028425523200.0 +
                   auVar102._0_8_ +
                   auVar107._0_8_ +
                   auVar89._0_8_ +
                   auVar95._0_8_ +
                   auVar112._0_8_ +
                   ((((auVar108._8_8_ + auVar108._0_8_) - auVar117._8_8_) + auVar117._0_8_) -
                   auVar110._8_8_) + auVar110._0_8_;
        }
        else {
          dVar41 = dVar40 * dVar40 * 64.0;
          dVar20 = dVar40 * 24.0 *
                   (dVar40 * -36.0 +
                    dVar20 * 17.724538509055158 * dVar24 + (dVar40 * 20.0 - dVar41) * dVar23 +
                    dVar41 + -3.0) + 1.0;
        }
        dVar77 = (dVar77 / dVar14) * local_1e0;
        dVar40 = dVar77 * 0.14554132;
        dVar24 = auVar75._0_8_ * 3.3019272488946267 * 0.043662396;
        dVar23 = 0.32;
        if (dVar19 <= 0.32) {
          dVar23 = dVar19;
        }
        dVar42 = dVar23 * dVar23;
        dVar41 = exp((-1.0 / dVar42) * 0.25);
        dVar25 = erf((1.0 / dVar23) * 0.5);
        if (0.32 <= dVar19) {
          if (dVar19 <= 0.32) {
            dVar19 = 0.32;
          }
          dVar19 = dVar19 * dVar19;
          dVar23 = dVar19 * dVar19;
          dVar41 = dVar19 * dVar23;
          auVar28._8_8_ = dVar41;
          auVar28._0_8_ = dVar23;
          auVar44._0_8_ = dVar23 * dVar23;
          dVar25 = auVar44._0_8_ * auVar44._0_8_;
          auVar81._0_8_ = 1.0 / dVar25;
          auVar81._8_8_ = auVar81._0_8_;
          auVar100._8_8_ = auVar81._0_8_;
          auVar100._0_8_ = auVar81._0_8_;
          auVar104._8_8_ = auVar81._0_8_;
          auVar104._0_8_ = auVar81._0_8_;
          auVar5._8_8_ = auVar44._0_8_ * dVar41;
          auVar5._0_8_ = auVar44._0_8_ * dVar23;
          auVar89 = divpd(auVar81,auVar5);
          auVar92._8_8_ = auVar81._0_8_ / dVar19;
          auVar92._0_8_ = auVar81._0_8_;
          auVar107 = divpd(auVar92,_DAT_010ab7e0);
          auVar95 = divpd(auVar100,auVar28);
          auVar112 = divpd(auVar95,_DAT_010ab7f0);
          auVar44._8_8_ = dVar19 * auVar44._0_8_;
          auVar95 = divpd(auVar104,auVar44);
          auVar115 = divpd(auVar95,_DAT_010ab800);
          auVar102 = divpd(auVar89,_DAT_010ab810);
          auVar45._0_8_ = 1.0 / (dVar25 * dVar25);
          auVar71._8_8_ = auVar45._0_8_ / dVar19;
          auVar71._0_8_ = auVar45._0_8_;
          auVar95 = divpd(auVar71,_DAT_010ab820);
          auVar45._8_8_ = auVar45._0_8_;
          auVar89 = divpd(auVar45,auVar28);
          auVar89 = divpd(auVar89,_DAT_010ab830);
          dVar19 = ((((((((((((1.0 / (auVar44._0_8_ * dVar41)) / -115811942400.0 +
                              (1.0 / (auVar44._0_8_ * dVar23)) / 2530344960.0 +
                              (1.0 / (dVar19 * auVar44._0_8_)) / -61501440.0 +
                              (1.0 / auVar44._0_8_) * 5.871587902837903e-07 +
                              (1.0 / dVar41) / -56448.0 + 0.0003826530612244898 / dVar23 +
                             auVar107._0_8_) - auVar107._8_8_) + auVar112._0_8_) - auVar112._8_8_) +
                         auVar115._0_8_) - auVar115._8_8_) + auVar102._0_8_) - auVar102._8_8_) +
                     auVar95._0_8_) - auVar95._8_8_) + auVar89._0_8_) - auVar89._8_8_;
        }
        else {
          dVar19 = dVar42 * dVar42;
          dVar69 = dVar23 * dVar42;
          dVar19 = dVar23 * 1.1428571428571428 *
                   ((dVar19 * dVar19 * dVar23 * -122880.0 +
                    dVar19 * dVar69 * 3840.0 +
                    dVar23 * dVar19 * -576.0 + dVar23 * -8.0 + dVar69 * 256.0) * dVar41 +
                   (dVar42 * 60.0 + -2.0) * 3.5449077018110318 * dVar25 +
                   (dVar42 * dVar19 * 5120.0 + dVar19 * -1440.0 + dVar42 * 224.0 + -35.0) *
                   dVar69 * 24.0) + 1.0;
        }
        dVar41 = (auVar26._8_8_ * dVar39) / 18.0;
        dVar23 = 1.35;
        if (dVar41 <= 1.35) {
          dVar23 = dVar41;
        }
        dVar25 = erf((1.0 / dVar23) * 0.5);
        dVar42 = exp((-1.0 / (dVar23 * dVar23)) * 0.25);
        if (1.35 <= dVar41) {
          if (dVar41 <= 1.35) {
            dVar41 = 1.35;
          }
          auVar82._0_8_ = dVar41 * dVar41;
          dVar23 = auVar82._0_8_ * auVar82._0_8_;
          auVar82._8_8_ = dVar23;
          dVar41 = dVar23 * dVar23;
          auVar61._0_8_ = auVar82._0_8_ * dVar23;
          auVar61._8_8_ = dVar41 * dVar41;
          auVar26 = divpd(_DAT_0103b460,auVar82);
          auVar102 = divpd(auVar26,_DAT_01049d80);
          auVar46._8_8_ = dVar41;
          auVar46._0_8_ = auVar61._0_8_;
          auVar95 = divpd(_DAT_0103b460,auVar46);
          uVar76 = auVar95._8_8_;
          auVar29._8_8_ = 0x3ff0000000000000;
          auVar29._0_8_ = uVar76;
          auVar26 = divpd(auVar29,auVar61);
          auVar47._8_8_ = uVar76;
          auVar47._0_8_ = uVar76;
          auVar89 = divpd(auVar47,auVar82);
          auVar95 = divpd(auVar95,_DAT_01049d90);
          auVar89 = divpd(auVar89,_DAT_01049da0);
          auVar26 = divpd(auVar26,_DAT_01049db0);
          local_298 = ((((((auVar102._0_8_ - auVar102._8_8_) + auVar95._0_8_) - auVar95._8_8_) +
                        auVar89._0_8_) - auVar89._8_8_) + auVar26._0_8_) - auVar26._8_8_;
        }
        else {
          local_298 = dVar23 * -2.6666666666666665 *
                      (dVar25 * 1.7724538509055159 +
                      (dVar42 + -1.5 + (dVar42 + -1.0) * dVar23 * dVar23 * -2.0) * (dVar23 + dVar23)
                      ) + 1.0;
        }
        dVar23 = dVar78 / 36.0 +
                 (dVar77 + dVar35 * -0.125) * 1.8171205928321397 * dVar56 * 0.25 + -0.45;
        dVar23 = pow(dVar36 * dVar23 * -1.0814814814814815 * (1.0 - dVar36) +
                     dVar23 * dVar23 * 0.7209876543209877 +
                     auVar58._8_8_ *
                     (dVar78 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397 *
                     0.4166666666666667 * local_1f8 * dVar56 + 1.0,0.1);
        dVar77 = auVar75._0_8_ * 3.3019272488946267 * 0.256337604;
        dVar41 = 0.0;
        if (dVar57 < dVar14) {
          dVar57 = 1.0 / (dVar22 * dVar22);
          dVar41 = dVar38 + 1.0;
          dVar36 = (1.0 / (dVar41 * dVar41)) * (dVar38 * 3.0 + dVar36 * dVar36);
          dVar41 = (double)(-(ulong)(dVar67 <= dVar15) & (ulong)(dVar15 * dVar16) |
                           ~-(ulong)(dVar67 <= dVar15) & (ulong)(dVar17 * dVar67)) * dVar18 *
                   -0.36927938319101117 *
                   ((1.0 - dVar36) * dVar23 +
                   ((((dVar35 * 0.011867481666666667 + dVar40 + dVar77) * 0.5555555555555556 *
                      -1.8171205928321397 * dVar56 + dVar78 * 0.06394332777777778 + 1.0) *
                     0.7777777777777778 * dVar57 + 1.0 / dVar22) * dVar36 -
                   ((local_258 * (1.0 / dVar22) +
                     dVar21 * dVar57 *
                     (dVar35 * 0.04229627833333333 + (dVar24 - dVar40)) * dVar20 *
                     0.43209876543209874 +
                    dVar19 * 1.8171205928321397 * dVar56 * 0.026329605555555555 * dVar35 * dVar57) *
                    dVar36 + local_298 * (1.0 - dVar36) * dVar23) * p->cam_beta));
        }
        dVar57 = p->dens_threshold;
        dVar36 = dVar37;
        if (dVar15 < dVar91) {
          dVar36 = (double)((ulong)dVar96 & uVar11 | ~uVar11 & (ulong)(dVar90 * -(dVar14 - __x)));
        }
        dVar36 = dVar36 + 1.0;
        uVar11 = -(ulong)(dVar36 <= p->zeta_threshold);
        dVar14 = cbrt(dVar36);
        auVar6._8_8_ = __x;
        auVar6._0_8_ = dVar55;
        auVar26 = divpd(_DAT_0103b460,auVar6);
        dVar17 = auVar26._8_8_ * local_260 * auVar26._0_8_ * 0.125;
        if (1.0 <= dVar17) {
          dVar17 = 1.0;
        }
        dVar67 = dVar17 * dVar17 * dVar17;
        dVar19 = __x * __x;
        dVar90 = cbrt(__x);
        dVar20 = 1.0 / (dVar90 * dVar90);
        dVar91 = dVar20 / dVar19;
        dVar22 = local_260 * dVar91;
        dVar96 = dVar21 * dVar22;
        dVar19 = local_260 * local_260 * dVar68 * ((1.0 / dVar90) / (dVar19 * dVar19 * __x)) +
                 dVar96 * 0.1504548888888889 + 1.0;
        dVar90 = pow(dVar19,0.1);
        dVar37 = (double)((ulong)dVar37 & uVar10 |
                         ~uVar10 & ((~uVar12 & (ulong)dVar99 | uVar12 & (ulong)dVar37) ^
                                   0x8000000000000000)) + 1.0;
        uVar10 = -(ulong)(dVar37 <= p->zeta_threshold);
        dVar37 = cbrt(dVar37);
        auVar48._8_8_ = uVar10 & (ulong)dVar16 | ~uVar10 & (ulong)dVar37;
        auVar48._0_8_ = dVar90;
        auVar26 = divpd(_DAT_0103b460,auVar48);
        dVar90 = (auVar26._0_8_ * auVar26._8_8_ * dVar39) / 18.0;
        dVar37 = 1e-10;
        if (1e-10 <= dVar90) {
          dVar37 = dVar90;
        }
        dVar90 = 1.35;
        if (dVar37 <= 1.35) {
          dVar90 = dVar37;
        }
        dVar99 = erf((1.0 / dVar90) * 0.5);
        dVar23 = exp((-1.0 / (dVar90 * dVar90)) * 0.25);
        if (1.35 <= dVar37) {
          dVar90 = dVar37;
          if (dVar37 <= 1.35) {
            dVar90 = 1.35;
          }
          auVar30._0_8_ = dVar90 * dVar90;
          dVar90 = auVar30._0_8_ * auVar30._0_8_;
          auVar30._8_8_ = dVar90;
          dVar99 = dVar90 * dVar90;
          auVar72._0_8_ = auVar30._0_8_ * dVar90;
          auVar72._8_8_ = dVar99 * dVar99;
          auVar58 = divpd(_DAT_0103b460,auVar30);
          auVar95 = divpd(auVar58,_DAT_01049d80);
          auVar62._8_8_ = dVar99;
          auVar62._0_8_ = auVar72._0_8_;
          auVar89 = divpd(_DAT_0103b460,auVar62);
          uVar76 = auVar89._8_8_;
          auVar49._8_8_ = 0x3ff0000000000000;
          auVar49._0_8_ = uVar76;
          auVar58 = divpd(auVar49,auVar72);
          auVar63._8_8_ = uVar76;
          auVar63._0_8_ = uVar76;
          auVar75 = divpd(auVar63,auVar30);
          auVar89 = divpd(auVar89,_DAT_01049d90);
          auVar75 = divpd(auVar75,_DAT_01049da0);
          auVar58 = divpd(auVar58,_DAT_01049db0);
          local_298 = ((((((auVar95._0_8_ - auVar95._8_8_) + auVar89._0_8_) - auVar89._8_8_) +
                        auVar75._0_8_) - auVar75._8_8_) + auVar58._0_8_) - auVar58._8_8_;
        }
        else {
          local_298 = dVar90 * -2.6666666666666665 *
                      (dVar99 * 1.7724538509055159 +
                      (dVar23 + -1.5 + (dVar23 + -1.0) * dVar90 * dVar90 * -2.0) * (dVar90 + dVar90)
                      ) + 1.0;
        }
        dVar99 = pow(dVar19,0.2);
        dVar90 = 0.27;
        if (dVar37 <= 0.27) {
          dVar90 = dVar37;
        }
        dVar35 = dVar90 * dVar90;
        dVar19 = exp((-1.0 / dVar35) * 0.25);
        dVar23 = erf((1.0 / dVar90) * 0.5);
        if (0.27 <= dVar37) {
          dVar90 = dVar37;
          if (dVar37 <= 0.27) {
            dVar90 = 0.27;
          }
          auVar64._0_8_ = dVar90 * dVar90;
          auVar50._0_8_ = auVar64._0_8_ * auVar64._0_8_;
          auVar31._0_8_ = auVar64._0_8_ * auVar50._0_8_;
          auVar31._8_8_ = auVar50._0_8_ * auVar50._0_8_;
          auVar83._0_8_ = auVar50._0_8_ * auVar31._8_8_;
          auVar83._8_8_ = auVar31._0_8_ * auVar31._8_8_;
          dVar90 = auVar31._8_8_ * auVar31._8_8_;
          auVar88._0_8_ = auVar64._0_8_ * auVar31._8_8_;
          auVar88._8_8_ = auVar64._0_8_ * dVar90;
          auVar105._0_8_ = 1.0 / (dVar90 * dVar90);
          auVar73._8_8_ = 0x3ff0000000000000;
          auVar73._0_8_ = auVar105._0_8_;
          auVar93._8_8_ = 0x3ff0000000000000;
          auVar93._0_8_ = auVar105._0_8_;
          auVar4._8_8_ = dVar90;
          auVar4._0_8_ = auVar31._8_8_;
          auVar89 = divpd(auVar93,auVar4);
          dVar90 = auVar89._8_8_;
          auVar111._0_8_ = -dVar90;
          auVar111._8_8_ = dVar90;
          auVar58 = divpd(auVar111,auVar31);
          auVar112 = divpd(auVar58,_DAT_010ab750);
          auVar113._8_8_ = auVar88._0_8_;
          auVar113._0_8_ = auVar83._0_8_;
          auVar118._8_8_ = dVar90;
          auVar118._0_8_ = dVar90;
          auVar58 = divpd(auVar118,auVar113);
          auVar119 = divpd(auVar58,_DAT_010ab760);
          auVar114._8_8_ = dVar90 / auVar83._8_8_;
          auVar114._0_8_ = auVar105._0_8_;
          auVar115 = divpd(auVar114,_DAT_010ab770);
          auVar105._8_8_ = auVar105._0_8_;
          auVar58 = divpd(auVar105,auVar83);
          auVar107 = divpd(auVar58,_DAT_010ab780);
          auVar64._8_8_ = auVar88._0_8_;
          auVar98._8_8_ = 0x3ff0000000000000;
          auVar98._0_8_ = auVar105._0_8_;
          auVar58 = divpd(auVar98,auVar64);
          auVar102 = divpd(auVar58,_DAT_010ab790);
          auVar50._8_8_ = auVar83._0_8_;
          auVar65._8_8_ = 0x3ff0000000000000;
          auVar65._0_8_ = auVar105._0_8_;
          auVar58 = divpd(auVar65,auVar50);
          auVar75 = divpd(auVar58,_DAT_010ab7a0);
          auVar84._8_8_ = auVar83._8_8_;
          auVar84._0_8_ = auVar31._0_8_;
          auVar32._8_8_ = 0x3ff0000000000000;
          auVar32._0_8_ = auVar105._0_8_;
          auVar58 = divpd(auVar32,auVar84);
          auVar58 = divpd(auVar58,_DAT_010ab7b0);
          auVar95 = divpd(auVar89,_DAT_010ab7c0);
          auVar89 = divpd(auVar73,auVar88);
          auVar89 = divpd(auVar89,_DAT_010ab7d0);
          dVar90 = auVar89._8_8_ +
                   auVar95._8_8_ +
                   auVar58._8_8_ +
                   auVar75._8_8_ +
                   auVar102._8_8_ +
                   (1.0 / auVar31._8_8_) * 3.804788961038961e-06 +
                   (1.0 / auVar31._0_8_) / -11520.0 +
                   0.0013392857142857143 / auVar50._0_8_ + (auVar107._0_8_ - auVar107._8_8_) +
                   (dVar90 / auVar50._0_8_) / 927028425523200.0 +
                   auVar89._0_8_ +
                   auVar95._0_8_ +
                   auVar58._0_8_ +
                   auVar75._0_8_ +
                   auVar102._0_8_ +
                   ((((auVar112._8_8_ + auVar112._0_8_) - auVar119._8_8_) + auVar119._0_8_) -
                   auVar115._8_8_) + auVar115._0_8_;
        }
        else {
          dVar38 = dVar35 * dVar35 * 64.0;
          dVar90 = dVar35 * 24.0 *
                   (dVar35 * -36.0 +
                    dVar90 * 17.724538509055158 * dVar23 + (dVar35 * 20.0 - dVar38) * dVar19 +
                    dVar38 + -3.0) + 1.0;
        }
        dVar20 = (dVar20 / __x) * dVar55;
        dVar23 = dVar20 * 0.14554132;
        dVar19 = 0.32;
        if (dVar37 <= 0.32) {
          dVar19 = dVar37;
        }
        dVar68 = dVar19 * dVar19;
        dVar35 = exp((-1.0 / dVar68) * 0.25);
        dVar38 = erf((1.0 / dVar19) * 0.5);
        if (0.32 <= dVar37) {
          if (dVar37 <= 0.32) {
            dVar37 = 0.32;
          }
          dVar37 = dVar37 * dVar37;
          dVar19 = dVar37 * dVar37;
          dVar35 = dVar37 * dVar19;
          auVar33._8_8_ = dVar35;
          auVar33._0_8_ = dVar19;
          auVar51._0_8_ = dVar19 * dVar19;
          dVar38 = auVar51._0_8_ * auVar51._0_8_;
          auVar85._0_8_ = 1.0 / dVar38;
          auVar85._8_8_ = auVar85._0_8_;
          auVar101._8_8_ = auVar85._0_8_;
          auVar101._0_8_ = auVar85._0_8_;
          auVar106._8_8_ = auVar85._0_8_;
          auVar106._0_8_ = auVar85._0_8_;
          auVar3._8_8_ = auVar51._0_8_ * dVar35;
          auVar3._0_8_ = auVar51._0_8_ * dVar19;
          auVar58 = divpd(auVar85,auVar3);
          auVar94._8_8_ = auVar85._0_8_ / dVar37;
          auVar94._0_8_ = auVar85._0_8_;
          auVar95 = divpd(auVar94,_DAT_010ab7e0);
          auVar75 = divpd(auVar101,auVar33);
          auVar102 = divpd(auVar75,_DAT_010ab7f0);
          auVar51._8_8_ = dVar37 * auVar51._0_8_;
          auVar75 = divpd(auVar106,auVar51);
          auVar107 = divpd(auVar75,_DAT_010ab800);
          auVar89 = divpd(auVar58,_DAT_010ab810);
          auVar52._0_8_ = 1.0 / (dVar38 * dVar38);
          auVar74._8_8_ = auVar52._0_8_ / dVar37;
          auVar74._0_8_ = auVar52._0_8_;
          auVar75 = divpd(auVar74,_DAT_010ab820);
          auVar52._8_8_ = auVar52._0_8_;
          auVar58 = divpd(auVar52,auVar33);
          auVar58 = divpd(auVar58,_DAT_010ab830);
          dVar37 = ((((((((((((1.0 / (auVar51._0_8_ * dVar35)) / -115811942400.0 +
                              (1.0 / (auVar51._0_8_ * dVar19)) / 2530344960.0 +
                              (1.0 / (dVar37 * auVar51._0_8_)) / -61501440.0 +
                              (1.0 / auVar51._0_8_) * 5.871587902837903e-07 +
                              (1.0 / dVar35) / -56448.0 + 0.0003826530612244898 / dVar19 +
                             auVar95._0_8_) - auVar95._8_8_) + auVar102._0_8_) - auVar102._8_8_) +
                         auVar107._0_8_) - auVar107._8_8_) + auVar89._0_8_) - auVar89._8_8_) +
                     auVar75._0_8_) - auVar75._8_8_) + auVar58._0_8_) - auVar58._8_8_;
        }
        else {
          dVar37 = dVar68 * dVar68;
          dVar78 = dVar19 * dVar68;
          dVar37 = dVar19 * 1.1428571428571428 *
                   ((dVar37 * dVar37 * dVar19 * -122880.0 +
                    dVar37 * dVar78 * 3840.0 +
                    dVar19 * dVar37 * -576.0 + dVar19 * -8.0 + dVar78 * 256.0) * dVar35 +
                   (dVar68 * 60.0 + -2.0) * 3.5449077018110318 * dVar38 +
                   (dVar68 * dVar37 * 5120.0 + dVar37 * -1440.0 + dVar68 * 224.0 + -35.0) *
                   dVar78 * 24.0) + 1.0;
        }
        dVar35 = (dVar39 * auVar26._8_8_) / 18.0;
        dVar19 = 1.35;
        if (dVar35 <= 1.35) {
          dVar19 = dVar35;
        }
        dVar38 = erf((1.0 / dVar19) * 0.5);
        dVar39 = exp((-1.0 / (dVar19 * dVar19)) * 0.25);
        if (1.35 <= dVar35) {
          if (dVar35 <= 1.35) {
            dVar35 = 1.35;
          }
          auVar86._0_8_ = dVar35 * dVar35;
          dVar19 = auVar86._0_8_ * auVar86._0_8_;
          auVar86._8_8_ = dVar19;
          dVar35 = dVar19 * dVar19;
          auVar66._0_8_ = auVar86._0_8_ * dVar19;
          auVar66._8_8_ = dVar35 * dVar35;
          auVar26 = divpd(_DAT_0103b460,auVar86);
          auVar89 = divpd(auVar26,_DAT_01049d80);
          auVar53._8_8_ = dVar35;
          auVar53._0_8_ = auVar66._0_8_;
          auVar75 = divpd(_DAT_0103b460,auVar53);
          uVar76 = auVar75._8_8_;
          auVar34._8_8_ = 0x3ff0000000000000;
          auVar34._0_8_ = uVar76;
          auVar26 = divpd(auVar34,auVar66);
          auVar54._8_8_ = uVar76;
          auVar54._0_8_ = uVar76;
          auVar58 = divpd(auVar54,auVar86);
          auVar75 = divpd(auVar75,_DAT_01049d90);
          auVar58 = divpd(auVar58,_DAT_01049da0);
          auVar26 = divpd(auVar26,_DAT_01049db0);
          local_2a8 = ((((((auVar89._0_8_ - auVar89._8_8_) + auVar75._0_8_) - auVar75._8_8_) +
                        auVar58._0_8_) - auVar58._8_8_) + auVar26._0_8_) - auVar26._8_8_;
        }
        else {
          local_2a8 = dVar19 * -2.6666666666666665 *
                      (dVar38 * 1.7724538509055159 +
                      (dVar39 + -1.5 + (dVar39 + -1.0) * dVar19 * dVar19 * -2.0) * (dVar19 + dVar19)
                      ) + 1.0;
        }
        dVar19 = dVar96 / 36.0 +
                 (dVar20 + dVar22 * -0.125) * 1.8171205928321397 * dVar56 * 0.25 + -0.45;
        dVar91 = pow(dVar17 * dVar19 * -1.0814814814814815 * (1.0 - dVar17) +
                     dVar19 * dVar19 * 0.7209876543209877 +
                     (dVar96 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397 *
                     0.4166666666666667 * local_260 * dVar56 * dVar91 + 1.0,0.1);
        dVar19 = 0.0;
        if (dVar57 < __x) {
          dVar57 = 1.0 / (dVar99 * dVar99);
          dVar19 = dVar67 + 1.0;
          dVar17 = (1.0 / (dVar19 * dVar19)) * (dVar67 * 3.0 + dVar17 * dVar17);
          dVar19 = dVar18 * (double)((ulong)(dVar15 * dVar16) & uVar11 |
                                    ~uVar11 & (ulong)(dVar36 * dVar14)) * -0.36927938319101117 *
                   ((1.0 - dVar17) * dVar91 +
                   ((((dVar22 * 0.011867481666666667 + dVar77 + dVar23) * 0.5555555555555556 *
                      -1.8171205928321397 * dVar56 + dVar96 * 0.06394332777777778 + 1.0) *
                     0.7777777777777778 * dVar57 + 1.0 / dVar99) * dVar17 -
                   ((local_298 * (1.0 / dVar99) +
                     dVar21 * dVar57 *
                     (dVar22 * 0.04229627833333333 + (dVar24 - dVar23)) * dVar90 *
                     0.43209876543209874 +
                    dVar37 * 1.8171205928321397 * dVar56 * 0.026329605555555555 * dVar22 * dVar57) *
                    dVar17 + local_2a8 * (1.0 - dVar17) * dVar91) * p->cam_beta));
        }
        pdVar2 = out->zk;
        if ((pdVar2 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar7 = (long)(p->dim).zk * sVar8;
          pdVar2[lVar7] = dVar41 + dVar19 + pdVar2[lVar7];
        }
      }
      sVar8 = sVar8 + 1;
    } while (np != sVar8);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}